

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::UnknownField::InternalSerializeLengthDelimitedNoTag
          (UnknownField *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint32 value;
  uint8 *puVar1;
  uint8 *in_RSI;
  EpsCopyOutputStream *in_RDI;
  string *data;
  int in_stack_ffffffffffffff7c;
  void *in_stack_ffffffffffffff80;
  
  value = std::__cxx11::string::size();
  io::CodedOutputStream::WriteVarint32ToArray(value,in_RSI);
  puVar1 = (uint8 *)std::__cxx11::string::data();
  std::__cxx11::string::size();
  puVar1 = io::EpsCopyOutputStream::WriteRaw
                     (in_RDI,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,puVar1);
  return puVar1;
}

Assistant:

uint8* UnknownField::InternalSerializeLengthDelimitedNoTag(
    uint8* target, io::EpsCopyOutputStream* stream) const {
  GOOGLE_DCHECK_EQ(TYPE_LENGTH_DELIMITED, type());
  const std::string& data = *data_.length_delimited_.string_value;
  target = io::CodedOutputStream::WriteVarint32ToArray(data.size(), target);
  target = stream->WriteRaw(data.data(), data.size(), target);
  return target;
}